

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O0

bool day4a::is_real_room(string *name,string *checksum)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  iterator pvVar4;
  iterator pvVar5;
  reference pvVar6;
  char *pcVar7;
  int local_88;
  int i;
  value_type *l;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  array<std::pair<char,_char>,_26UL> letters;
  string *checksum_local;
  string *name_local;
  
  letters._M_elems._44_8_ = checksum;
  std::array<std::pair<char,_char>,_26UL>::array
            ((array<std::pair<char,_char>,_26UL> *)((long)&__range1 + 4));
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_70._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff90), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 != '-') {
      pvVar6 = std::array<std::pair<char,_char>,_26UL>::operator[]
                         ((array<std::pair<char,_char>,_26UL> *)((long)&__range1 + 4),
                          (long)(cVar1 + -0x61));
      pvVar6->first = cVar1;
      pvVar6->second = pvVar6->second + '\x01';
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = std::array<std::pair<char,_char>,_26UL>::begin
                     ((array<std::pair<char,_char>,_26UL> *)((long)&__range1 + 4));
  pvVar5 = std::array<std::pair<char,_char>,_26UL>::end
                     ((array<std::pair<char,_char>,_26UL> *)((long)&__range1 + 4));
  std::
  sort<std::pair<char,char>*,day4a::is_real_room(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            (pvVar4,pvVar5);
  local_88 = 0;
  while( true ) {
    if (4 < local_88) {
      return true;
    }
    pvVar6 = std::array<std::pair<char,_char>,_26UL>::operator[]
                       ((array<std::pair<char,_char>,_26UL> *)((long)&__range1 + 4),(long)local_88);
    cVar1 = pvVar6->first;
    pcVar7 = (char *)std::__cxx11::string::operator[](letters._M_elems._44_8_);
    if (cVar1 != *pcVar7) break;
    local_88 = local_88 + 1;
  }
  return false;
}

Assistant:

bool is_real_room(const std::string& name, const std::string& checksum) {
		std::array<std::pair<char, char>, 26> letters;
		for(auto c : name) {
			if(c == '-') {
				continue;
			}
			auto& l = letters[c - 'a'];
			l.first = c;
			l.second++;
		}
		std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
			return a.second > b.second || (a.second == b.second && a.first < b.first);
		});
		for(int i = 0; i < 5; ++i) {
			if(letters[i].first != checksum[i]) {
				return false;
			}
		}
		return true;
	}